

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

EVstone INT_EVexecuting_stone(CManager_conflict cm)

{
  ev_handler_activation_ptr p_Var1;
  pthread_t pVar2;
  ev_handler_activation_ptr *pp_Var3;
  
  pp_Var3 = &cm->evp->activation_stack;
  pVar2 = pthread_self();
  while( true ) {
    p_Var1 = *pp_Var3;
    if (p_Var1 == (ev_handler_activation_ptr)0x0) {
      return -1;
    }
    if (p_Var1->thread_id == pVar2) break;
    pp_Var3 = &p_Var1->next;
  }
  return p_Var1->stone_id;
}

Assistant:

extern EVstone
INT_EVexecuting_stone(CManager cm)
{
    ev_handler_activation_ptr rec = find_activation_record_from_stack(cm);
    if (!rec) return -1;
    return rec->stone_id;
}